

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O2

CharFormat testing::internal::PrintCharsAsStringTo<char>(char *begin,size_t len,ostream *os)

{
  byte ch;
  long lVar1;
  bool bVar2;
  CharFormat CVar3;
  ostream *poVar4;
  size_t index;
  size_t sVar5;
  CharFormat CVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::operator<<(os,"\"");
  CVar6 = kAsIs;
  bVar2 = false;
  for (sVar5 = 0; len != sVar5; sVar5 = sVar5 + 1) {
    ch = begin[sVar5];
    if (bVar2) {
      bVar2 = IsXDigit(ch);
      if (bVar2) {
        poVar4 = std::operator<<(os,"\" ");
        std::operator<<(poVar4,"\"");
      }
    }
    CVar3 = PrintAsStringLiteralTo((uint)ch,os);
    bVar2 = CVar3 == kHexEscape;
    if (bVar2) {
      CVar6 = kHexEscape;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::operator<<(os,"\"");
    return CVar6;
  }
  __stack_chk_fail();
}

Assistant:

static CharFormat PrintCharsAsStringTo(
    const CharType* begin, size_t len, ostream* os) {
  const char* const kQuoteBegin = sizeof(CharType) == 1 ? "\"" : "L\"";
  *os << kQuoteBegin;
  bool is_previous_hex = false;
  CharFormat print_format = kAsIs;
  for (size_t index = 0; index < len; ++index) {
    const CharType cur = begin[index];
    if (is_previous_hex && IsXDigit(cur)) {
      // Previous character is of '\x..' form and this character can be
      // interpreted as another hexadecimal digit in its number. Break string to
      // disambiguate.
      *os << "\" " << kQuoteBegin;
    }
    is_previous_hex = PrintAsStringLiteralTo(cur, os) == kHexEscape;
    // Remember if any characters required hex escaping.
    if (is_previous_hex) {
      print_format = kHexEscape;
    }
  }
  *os << "\"";
  return print_format;
}